

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

void __thiscall RootIndexProxyModel::fetchMore(RootIndexProxyModel *this,QModelIndex *parent)

{
  RootIndexProxyModelPrivate *pRVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  QModelIndex local_30;
  
  lVar3 = QAbstractProxyModel::sourceModel();
  if (lVar3 != 0) {
    pRVar1 = this->m_dptr;
    local_30.r = -1;
    local_30.c = -1;
    local_30.i = 0;
    local_30.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(parent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_30,this,parent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_30,&pRVar1->m_rootIndex);
    }
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar4 + 0x128))(plVar4,&local_30);
  }
  return;
}

Assistant:

void RootIndexProxyModel::fetchMore(const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    sourceModel()->fetchMore(sourceParent);
}